

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void PType::StaticInit(void)

{
  PType *pPVar1;
  PPointer *this;
  PStruct *pPVar2;
  PField *this_00;
  PSymbolType *pPVar3;
  FName local_90;
  FName local_8c;
  FName local_88;
  FName local_84;
  FName local_80;
  FName local_7c;
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FName local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  FName local_38;
  undefined4 local_34;
  undefined4 local_30;
  FName local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  FName local_18;
  FName local_14;
  
  addterm(ReleaseGlobalSymbols,"ReleaseGlobalSymbols");
  *(PClass **)
   &PErrorType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PErrorType::RegistrationInfo.MyClass;
  *(PClass **)
   &PVoidType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PVoidType::RegistrationInfo.MyClass;
  *(PClass **)
   &PInt::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PInt::RegistrationInfo.MyClass;
  *(PClass **)
   &PBool::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PBool::RegistrationInfo.MyClass;
  *(PClass **)
   &PFloat::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PFloat::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PString::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PString::RegistrationInfo.MyClass;
  *(PClass **)
   &PName::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PName::RegistrationInfo.MyClass;
  *(PClass **)
   &PSound::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PSound::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PSpriteID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PSpriteID::RegistrationInfo.MyClass;
  *(PClass **)
   &PTextureID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PTextureID::RegistrationInfo.MyClass;
  *(PClass **)
   &PColor::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PColor::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PClassPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PClassPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PEnum::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PEnum::RegistrationInfo.MyClass;
  *(PClass **)
   &PArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PArray::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PDynArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PDynArray::RegistrationInfo.MyClass;
  *(PClass **)
   &PMap::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PMap::RegistrationInfo.MyClass;
  *(PClass **)
   &PStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PNativeStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PNativeStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PPrototype::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPrototype::RegistrationInfo.MyClass;
  *(PClass **)
   &PClass::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PClass::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PStatePointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStatePointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PStateLabel::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStateLabel::RegistrationInfo.MyClass;
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PErrorType::PErrorType((PErrorType *)pPVar1,1);
  TypeError = (PErrorType *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PErrorType::PErrorType((PErrorType *)pPVar1,2);
  TypeAuto = (PErrorType *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PVoidType::PVoidType((PVoidType *)pPVar1);
  TypeVoid = (PVoidType *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,1,false,true);
  TypeSInt8 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,1,true,true);
  TypeUInt8 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,2,false,true);
  TypeSInt16 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,2,true,true);
  TypeUInt16 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,4,false,true);
  TypeSInt32 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PInt::PInt((PInt *)pPVar1,4,true,true);
  TypeUInt32 = (PInt *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PBool::PBool((PBool *)pPVar1);
  TypeBool = (PBool *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PFloat::PFloat((PFloat *)pPVar1,4);
  TypeFloat32 = (PFloat *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PFloat::PFloat((PFloat *)pPVar1,8);
  TypeFloat64 = (PFloat *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PString::PString((PString *)pPVar1);
  TypeString = (PString *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PName::PName((PName *)pPVar1);
  TypeName = (PName *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PSound::PSound((PSound *)pPVar1);
  TypeSound = (PSound *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PColor::PColor((PColor *)pPVar1);
  TypeColor = (PColor *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0xa8);
  PStatePointer::PStatePointer((PStatePointer *)pPVar1);
  TypeState = (PStatePointer *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PStateLabel::PStateLabel((PStateLabel *)pPVar1);
  TypeStateLabel = (PStateLabel *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  this = (PPointer *)DObject::operator_new(0xa8);
  PPointer::PPointer(this);
  TypeNullPtr = this;
  FTypeTable::AddType(&TypeTable,(PType *)this);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PSpriteID::PSpriteID((PSpriteID *)pPVar1);
  TypeSpriteID = (PSpriteID *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  pPVar1 = (PType *)DObject::operator_new(0x98);
  PTextureID::PTextureID((PTextureID *)pPVar1);
  TypeTextureID = (PTextureID *)pPVar1;
  FTypeTable::AddType(&TypeTable,pPVar1);
  FName::FName(&local_14,"@ColorStruct");
  TypeColorStruct = NewStruct(&local_14,(PTypeBase *)0x0);
  local_18.Index = 0x259;
  TypeStringStruct = &NewNativeStruct(&local_18,(PTypeBase *)0x0)->super_PStruct;
  local_1c = 0x292;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_1c,TypeUInt8);
  local_20 = 0x291;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_20,TypeUInt8);
  local_24 = 0x290;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_24,TypeUInt8);
  local_28 = 0x28f;
  (*(TypeColorStruct->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject._vptr_DObject[0x15])(TypeColorStruct,&local_28,TypeUInt8);
  pPVar2 = (PStruct *)DObject::operator_new(0xc0);
  local_2c.Index = 0x261;
  PStruct::PStruct(pPVar2,&local_2c,(PTypeBase *)0x0);
  local_30 = 0xf1;
  TypeVector2 = pPVar2;
  (*(pPVar2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar2,&local_30,TypeFloat64);
  local_34 = 0xf2;
  (*(TypeVector2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector2,&local_34,TypeFloat64,0);
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector2);
  pPVar2 = TypeVector2;
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.loadOp = ' ';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.storeOp = '3';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.moveOp = '<';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x02';
  pPVar2 = (PStruct *)DObject::operator_new(0xc0);
  local_38.Index = 0x262;
  PStruct::PStruct(pPVar2,&local_38,(PTypeBase *)0x0);
  local_3c = 0xf1;
  TypeVector3 = pPVar2;
  (*(pPVar2->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar2,&local_3c,TypeFloat64);
  local_40 = 0xf2;
  (*(TypeVector3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector3,&local_40,TypeFloat64);
  local_44 = 0xf3;
  (*(TypeVector3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(TypeVector3,&local_44,TypeFloat64,0);
  pPVar2 = TypeVector3;
  this_00 = (PField *)DObject::operator_new(0x40);
  local_48.Index = 0xf4;
  PField::PField(this_00,&local_48,(PType *)TypeVector2,0x20000,0,0);
  PSymbolTable::AddSymbol
            (&(pPVar2->super_PNamedType).super_PCompoundType.super_PType.Symbols,(PSymbol *)this_00)
  ;
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector3);
  pPVar2 = TypeVector3;
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.loadOp = '\"';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.storeOp = '5';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.moveOp = '=';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (pPVar2->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x03';
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_4c.Index = 0x24a;
  PSymbolType::PSymbolType(pPVar3,&local_4c,(PType *)TypeSInt8);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_50.Index = 0x24b;
  PSymbolType::PSymbolType(pPVar3,&local_50,(PType *)TypeUInt8);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_54.Index = 0x24c;
  PSymbolType::PSymbolType(pPVar3,&local_54,(PType *)TypeSInt16);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_58.Index = 0x24d;
  PSymbolType::PSymbolType(pPVar3,&local_58,(PType *)TypeUInt16);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_5c.Index = 0x24e;
  PSymbolType::PSymbolType(pPVar3,&local_5c,(PType *)TypeSInt32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_60.Index = 0x24f;
  PSymbolType::PSymbolType(pPVar3,&local_60,(PType *)TypeUInt32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_64.Index = 0x250;
  PSymbolType::PSymbolType(pPVar3,&local_64,(PType *)TypeBool);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_68.Index = 0x255;
  PSymbolType::PSymbolType(pPVar3,&local_68,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_6c.Index = 600;
  PSymbolType::PSymbolType(pPVar3,&local_6c,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_70.Index = 0x256;
  PSymbolType::PSymbolType(pPVar3,&local_70,(PType *)TypeFloat32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_74.Index = 599;
  PSymbolType::PSymbolType(pPVar3,&local_74,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_78.Index = 0x259;
  PSymbolType::PSymbolType(pPVar3,&local_78,(PType *)TypeString);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_7c.Index = 0x1ea;
  PSymbolType::PSymbolType(pPVar3,&local_7c,(PType *)TypeName);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_80.Index = 0x25e;
  PSymbolType::PSymbolType(pPVar3,&local_80,(PType *)TypeSound);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_84.Index = 0x204;
  PSymbolType::PSymbolType(pPVar3,&local_84,(PType *)TypeColor);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_88.Index = 0x25f;
  PSymbolType::PSymbolType(pPVar3,&local_88,(PType *)TypeState);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_8c.Index = 0x261;
  PSymbolType::PSymbolType(pPVar3,&local_8c,(PType *)TypeVector2);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  pPVar3 = (PSymbolType *)DObject::operator_new(0x30);
  local_90.Index = 0x262;
  PSymbolType::PSymbolType(pPVar3,&local_90,(PType *)TypeVector3);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar3);
  return;
}

Assistant:

void PType::StaticInit()
{
	// Add types to the global symbol table.
	atterm(ReleaseGlobalSymbols);

	// Set up TypeTable hash keys.
	RUNTIME_CLASS(PErrorType)->TypeTableType = RUNTIME_CLASS(PErrorType);
	RUNTIME_CLASS(PVoidType)->TypeTableType = RUNTIME_CLASS(PVoidType);
	RUNTIME_CLASS(PInt)->TypeTableType = RUNTIME_CLASS(PInt);
	RUNTIME_CLASS(PBool)->TypeTableType = RUNTIME_CLASS(PBool);
	RUNTIME_CLASS(PFloat)->TypeTableType = RUNTIME_CLASS(PFloat);
	RUNTIME_CLASS(PString)->TypeTableType = RUNTIME_CLASS(PString);
	RUNTIME_CLASS(PName)->TypeTableType = RUNTIME_CLASS(PName);
	RUNTIME_CLASS(PSound)->TypeTableType = RUNTIME_CLASS(PSound);
	RUNTIME_CLASS(PSpriteID)->TypeTableType = RUNTIME_CLASS(PSpriteID);
	RUNTIME_CLASS(PTextureID)->TypeTableType = RUNTIME_CLASS(PTextureID);
	RUNTIME_CLASS(PColor)->TypeTableType = RUNTIME_CLASS(PColor);
	RUNTIME_CLASS(PPointer)->TypeTableType = RUNTIME_CLASS(PPointer);
	RUNTIME_CLASS(PClassPointer)->TypeTableType = RUNTIME_CLASS(PClassPointer);
	RUNTIME_CLASS(PEnum)->TypeTableType = RUNTIME_CLASS(PEnum);
	RUNTIME_CLASS(PArray)->TypeTableType = RUNTIME_CLASS(PArray);
	RUNTIME_CLASS(PDynArray)->TypeTableType = RUNTIME_CLASS(PDynArray);
	RUNTIME_CLASS(PMap)->TypeTableType = RUNTIME_CLASS(PMap);
	RUNTIME_CLASS(PStruct)->TypeTableType = RUNTIME_CLASS(PStruct);
	RUNTIME_CLASS(PNativeStruct)->TypeTableType = RUNTIME_CLASS(PNativeStruct);
	RUNTIME_CLASS(PPrototype)->TypeTableType = RUNTIME_CLASS(PPrototype);
	RUNTIME_CLASS(PClass)->TypeTableType = RUNTIME_CLASS(PClass);
	RUNTIME_CLASS(PStatePointer)->TypeTableType = RUNTIME_CLASS(PStatePointer);
	RUNTIME_CLASS(PStateLabel)->TypeTableType = RUNTIME_CLASS(PStateLabel);

	// Create types and add them type the type table.
	TypeTable.AddType(TypeError = new PErrorType);
	TypeTable.AddType(TypeAuto = new PErrorType(2));
	TypeTable.AddType(TypeVoid = new PVoidType);
	TypeTable.AddType(TypeSInt8 = new PInt(1, false));
	TypeTable.AddType(TypeUInt8 = new PInt(1, true));
	TypeTable.AddType(TypeSInt16 = new PInt(2, false));
	TypeTable.AddType(TypeUInt16 = new PInt(2, true));
	TypeTable.AddType(TypeSInt32 = new PInt(4, false));
	TypeTable.AddType(TypeUInt32 = new PInt(4, true));
	TypeTable.AddType(TypeBool = new PBool);
	TypeTable.AddType(TypeFloat32 = new PFloat(4));
	TypeTable.AddType(TypeFloat64 = new PFloat(8));
	TypeTable.AddType(TypeString = new PString);
	TypeTable.AddType(TypeName = new PName);
	TypeTable.AddType(TypeSound = new PSound);
	TypeTable.AddType(TypeColor = new PColor);
	TypeTable.AddType(TypeState = new PStatePointer);
	TypeTable.AddType(TypeStateLabel = new PStateLabel);
	TypeTable.AddType(TypeNullPtr = new PPointer);
	TypeTable.AddType(TypeSpriteID = new PSpriteID);
	TypeTable.AddType(TypeTextureID = new PTextureID);

	TypeColorStruct = NewStruct("@ColorStruct", nullptr);	//This name is intentionally obfuscated so that it cannot be used explicitly. The point of this type is to gain access to the single channels of a color value.
	TypeStringStruct = NewNativeStruct(NAME_String, nullptr);
#ifdef __BIG_ENDIAN__
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
#else
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
#endif

	TypeVector2 = new PStruct(NAME_Vector2, nullptr);
	TypeVector2->AddField(NAME_X, TypeFloat64);
	TypeVector2->AddField(NAME_Y, TypeFloat64);
	TypeTable.AddType(TypeVector2);
	TypeVector2->loadOp = OP_LV2;
	TypeVector2->storeOp = OP_SV2;
	TypeVector2->moveOp = OP_MOVEV2;
	TypeVector2->RegType = REGT_FLOAT;
	TypeVector2->RegCount = 2;

	TypeVector3 = new PStruct(NAME_Vector3, nullptr);
	TypeVector3->AddField(NAME_X, TypeFloat64);
	TypeVector3->AddField(NAME_Y, TypeFloat64);
	TypeVector3->AddField(NAME_Z, TypeFloat64);
	// allow accessing xy as a vector2. This is not supposed to be serialized so it's marked transient
	TypeVector3->Symbols.AddSymbol(new PField(NAME_XY, TypeVector2, VARF_Transient, 0));
	TypeTable.AddType(TypeVector3);
	TypeVector3->loadOp = OP_LV3;
	TypeVector3->storeOp = OP_SV3;
	TypeVector3->moveOp = OP_MOVEV3;
	TypeVector3->RegType = REGT_FLOAT;
	TypeVector3->RegCount = 3;



	GlobalSymbols.AddSymbol(new PSymbolType(NAME_sByte, TypeSInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Byte, TypeUInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Short, TypeSInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uShort, TypeUInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Int, TypeSInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uInt, TypeUInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Bool, TypeBool));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Double, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float32, TypeFloat32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float64, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_String, TypeString));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Name, TypeName));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Sound, TypeSound));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Color, TypeColor));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_State, TypeState));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector2, TypeVector2));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector3, TypeVector3));
}